

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbox.cpp
# Opt level: O0

int __thiscall
QToolBox::insertItem(QToolBox *this,int index,QWidget *widget,QIcon *icon,QString *text)

{
  QLatin1StringView str;
  int iVar1;
  QToolBoxPrivate *pQVar2;
  type pPVar3;
  QToolBoxButton *widget_00;
  QScrollArea *pQVar4;
  size_type sVar5;
  QWidget *in_RDX;
  int in_ESI;
  QToolBoxPrivate *in_RDI;
  long in_FS_OFFSET;
  int oldindex;
  QWidget *current;
  Page *c;
  QToolBoxPrivate *d;
  __single_object newPage;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  QToolBoxButton *in_stack_ffffffffffffff00;
  QWidget *in_stack_ffffffffffffff08;
  QFlagsStorage<Qt::AlignmentFlag> alignment;
  QToolBoxButton *in_stack_ffffffffffffff10;
  const_iterator in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  int iVar6;
  QToolBoxButton *this_00;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  int local_54;
  int local_44;
  undefined1 local_38 [4];
  undefined1 local_34 [4];
  Connection local_30 [3];
  undefined1 *local_18;
  Connection local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDX == (QWidget *)0x0) {
    local_44 = -1;
  }
  else {
    pQVar2 = d_func((QToolBox *)0x703035);
    QObject::connect((QObject *)&local_10,(char *)in_RDX,(QObject *)"2destroyed(QObject*)",
                     (char *)in_RDI,0xb2953d);
    QMetaObject::Connection::~Connection(&local_10);
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    std::make_unique<QToolBoxPrivate::Page>();
    pPVar3 = std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>::
             operator*((unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>
                        *)in_stack_ffffffffffffff00);
    pPVar3->widget = in_RDX;
    widget_00 = (QToolBoxButton *)operator_new(0x30);
    QToolBoxButton::QToolBoxButton
              (in_stack_ffffffffffffff00,
               (QWidget *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    pPVar3->button = widget_00;
    this_00 = pPVar3->button;
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_ffffffffffffff08,(size_t)in_stack_ffffffffffffff00);
    str.m_data = (char *)in_stack_ffffffffffffff18._M_current;
    str.m_size = (qsizetype)in_stack_ffffffffffffff10;
    QAnyStringView::QAnyStringView((QAnyStringView *)in_stack_ffffffffffffff08,str);
    QObject::setObjectName((QAnyStringView *)this_00);
    QObject::connect((QObject *)local_30,(char *)pPVar3->button,(QObject *)"2clicked()",
                     (char *)in_RDI,0xb29574);
    QMetaObject::Connection::~Connection(local_30);
    pQVar4 = (QScrollArea *)operator_new(0x28);
    QScrollArea::QScrollArea((QScrollArea *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    pPVar3->sv = pQVar4;
    QScrollArea::setWidget
              ((QScrollArea *)in_stack_ffffffffffffff10,
               (QWidget *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    QScrollArea::setWidgetResizable
              ((QScrollArea *)in_stack_ffffffffffffff10,
               SUB81((ulong)in_stack_ffffffffffffff08 >> 0x38,0));
    QWidget::hide((QWidget *)0x703202);
    QFrame::setFrameStyle
              ((QFrame *)in_stack_ffffffffffffff10,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
    QToolBoxPrivate::Page::setText
              ((Page *)in_stack_ffffffffffffff00,
               (QString *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    QToolBoxPrivate::Page::setIcon
              ((Page *)in_stack_ffffffffffffff00,
               (QIcon *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    if ((in_ESI < 0) ||
       (iVar6 = in_ESI,
       sVar5 = std::
               vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
               ::size(&pQVar2->pageList), (int)sVar5 <= iVar6)) {
      sVar5 = std::
              vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
              ::size(&pQVar2->pageList);
      local_54 = (int)sVar5;
      std::
      vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
      ::push_back((vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
                   *)in_stack_ffffffffffffff00,
                  (value_type *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      alignment.i = (Int)((ulong)pQVar2->layout >> 0x20);
      in_stack_ffffffffffffff10 = pPVar3->button;
      memset(local_34,0,4);
      QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x7032f3);
      QBoxLayout::addWidget
                ((QBoxLayout *)in_stack_ffffffffffffff00,
                 (QWidget *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),0,
                 (Alignment)alignment.i);
      memset(local_38,0,4);
      QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x703351);
      QBoxLayout::addWidget
                ((QBoxLayout *)in_stack_ffffffffffffff00,
                 (QWidget *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),0,
                 (Alignment)alignment.i);
      if (local_54 == 0) {
        setCurrentIndex((QToolBox *)in_stack_ffffffffffffff10,alignment.i);
      }
    }
    else {
      in_stack_ffffffffffffff00 = (QToolBoxButton *)&pQVar2->pageList;
      std::
      vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
      ::cbegin((vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
                *)in_stack_ffffffffffffff00);
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_*,_std::vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>_>
      ::operator+((__normal_iterator<const_std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_*,_std::vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>_>
                   *)in_stack_ffffffffffffff08,(difference_type)in_stack_ffffffffffffff00);
      iVar6 = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
      std::
      vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
      ::insert((vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
                *)in_stack_ffffffffffffff00,in_stack_ffffffffffffff18,
               (value_type *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      QToolBoxPrivate::relayout
                ((QToolBoxPrivate *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      local_54 = in_ESI;
      if ((pQVar2->currentPage != (Page *)0x0) &&
         (iVar1 = indexOf((QToolBox *)this_00,(QWidget *)widget_00), in_ESI <= iVar1)) {
        pQVar2->currentPage = (Page *)0x0;
        setCurrentIndex((QToolBox *)in_stack_ffffffffffffff10,iVar6);
      }
    }
    QWidget::show((QWidget *)in_stack_ffffffffffffff10);
    QToolBoxPrivate::updateTabs(in_RDI);
    (**(code **)(*(long *)&(in_RDI->super_QFramePrivate).super_QWidgetPrivate + 0x1a8))
              (in_RDI,local_54);
    local_44 = local_54;
    std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>::~unique_ptr
              ((unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_> *)
               in_stack_ffffffffffffff00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_44;
}

Assistant:

int QToolBox::insertItem(int index, QWidget *widget, const QIcon &icon, const QString &text)
{
    if (!widget)
        return -1;

    Q_D(QToolBox);
    connect(widget, SIGNAL(destroyed(QObject*)), this, SLOT(_q_widgetDestroyed(QObject*)));

    auto newPage = std::make_unique<QToolBoxPrivate::Page>();
    auto &c = *newPage;
    c.widget = widget;
    c.button = new QToolBoxButton(this);
    c.button->setObjectName("qt_toolbox_toolboxbutton"_L1);
    connect(c.button, SIGNAL(clicked()), this, SLOT(_q_buttonClicked()));

    c.sv = new QScrollArea(this);
    c.sv->setWidget(widget);
    c.sv->setWidgetResizable(true);
    c.sv->hide();
    c.sv->setFrameStyle(QFrame::NoFrame);

    c.setText(text);
    c.setIcon(icon);

    if (index < 0 || index >= static_cast<int>(d->pageList.size())) {
        index = static_cast<int>(d->pageList.size());
        d->pageList.push_back(std::move(newPage));
        d->layout->addWidget(c.button);
        d->layout->addWidget(c.sv);
        if (index == 0)
            setCurrentIndex(index);
    } else {
        d->pageList.insert(d->pageList.cbegin() + index, std::move(newPage));
        d->relayout();
        if (d->currentPage) {
            QWidget *current = d->currentPage->widget;
            int oldindex = indexOf(current);
            if (index <= oldindex) {
                d->currentPage = nullptr; // trigger change
                setCurrentIndex(oldindex);
            }
        }
    }

    c.button->show();

    d->updateTabs();
    itemInserted(index);
    return index;
}